

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O0

void __thiscall KDIS::KException::KException(KException *this,KUINT16 EC)

{
  KUINT16 ErrorCode;
  KUINT16 EC_local;
  KException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__KException_0032bc20;
  this->m_ui16ErrorCode = EC;
  KDIS::GetErrorText_abi_cxx11_(&this->m_sErrorText,(KDIS *)(ulong)EC,ErrorCode);
  return;
}

Assistant:

explicit KException(KUINT16 EC) :
        m_ui16ErrorCode( EC ),
        m_sErrorText( GetErrorText( EC ) )
    {
    }